

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool __thiscall ON_XMLNodePrivate::RemoveProperty(ON_XMLNodePrivate *this,wchar_t *name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ON_XMLProperty *local_30;
  ON_XMLProperty *pProp;
  ON_XMLProperty *pPrev;
  wchar_t *name_local;
  ON_XMLNodePrivate *this_local;
  
  pProp = (ON_XMLProperty *)0x0;
  local_30 = this->m_first_property;
  while( true ) {
    if (local_30 == (ON_XMLProperty *)0x0) {
      return false;
    }
    iVar1 = (*local_30->_vptr_ON_XMLProperty[2])();
    iVar1 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var,iVar1),name);
    if (iVar1 == 0) break;
    pProp = local_30;
    local_30 = local_30->_private->_next;
  }
  if (pProp == (ON_XMLProperty *)0x0) {
    iVar1 = (*local_30->_vptr_ON_XMLProperty[5])();
    this->m_first_property = (ON_XMLProperty *)CONCAT44(extraout_var_00,iVar1);
  }
  else {
    iVar1 = (*local_30->_vptr_ON_XMLProperty[5])();
    pProp->_private->_next = (ON_XMLProperty *)CONCAT44(extraout_var_01,iVar1);
  }
  if (local_30 != (ON_XMLProperty *)0x0) {
    (*local_30->_vptr_ON_XMLProperty[1])();
  }
  return true;
}

Assistant:

bool ON_XMLNodePrivate::RemoveProperty(const wchar_t* name)
{
  ON_XMLProperty* pPrev = nullptr;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    if (pProp->Name().CompareNoCase(name) == 0)
    {
      if (nullptr == pPrev)
      {
        m_first_property = pProp->Next();
      }
      else
      {
        pPrev->_private->_next = pProp->Next();
      }

      delete pProp;
      return true;
    }

    pPrev = pProp;
    pProp = pProp->_private->_next;
  }

  return false;
}